

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerdisplay.cpp
# Opt level: O2

bool __thiscall FListMenuItemPlayerDisplay::UpdatePlayerClass(FListMenuItemPlayerDisplay *this)

{
  FListMenuItem *pFVar1;
  bool bVar2;
  long lVar3;
  int classnum;
  FName seltype;
  int local_20;
  int local_1c;
  
  lVar3 = (long)this->mOwner->mSelectedItem;
  if (lVar3 < 0) {
    bVar2 = false;
  }
  else {
    pFVar1 = (this->mOwner->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Array[lVar3];
    (*pFVar1->_vptr_FListMenuItem[7])(&local_1c,pFVar1,&local_20);
    bVar2 = PlayerClasses.Count != 0 && local_1c == 500;
    if (PlayerClasses.Count != 0 && local_1c == 500) {
      SetPlayerClass(this,local_20,false);
    }
  }
  return bVar2;
}

Assistant:

bool FListMenuItemPlayerDisplay::UpdatePlayerClass()
{
	if (mOwner->mSelectedItem >= 0)
	{
		int classnum;
		FName seltype = mOwner->mItems[mOwner->mSelectedItem]->GetAction(&classnum);

		if (seltype != NAME_Episodemenu) return false;
		if (PlayerClasses.Size() == 0) return false;

		SetPlayerClass(classnum);
		return true;
	}
	return false;
}